

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.cpp
# Opt level: O3

int read_script_token(char *buf,size_t buflen,osfildef *fp)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  
  do {
    iVar2 = fgetc((FILE *)buflen);
    iVar3 = isspace(iVar2);
  } while (iVar3 != 0);
  if (iVar2 == 0x3e) {
    iVar2 = 0x3e;
  }
  else {
    uVar4 = 0;
    do {
      iVar3 = isspace(iVar2);
      if ((iVar3 != 0) || ((iVar2 + 1U < 0xf && ((0x4801U >> (iVar2 + 1U & 0x1f) & 1) != 0)))) {
        buf = buf + uVar4;
        goto LAB_00274a71;
      }
      uVar1 = uVar4 + 1;
      buf[uVar4] = (char)iVar2;
      iVar2 = fgetc((FILE *)buflen);
    } while ((uVar4 < 0x1e) && (uVar4 = uVar1, iVar2 != 0x3e));
    buf = buf + uVar1;
  }
LAB_00274a71:
  *buf = '\0';
  return iVar2;
}

Assistant:

static int read_script_token(char *buf, size_t buflen, osfildef *fp)
{
    char *p;
    int c;

    /* skip leading whitespace */
    for (c = osfgetc(fp) ; isspace(c) ; c = osfgetc(fp)) ;

    /* read from the file until we reach the end of the token */
    for (p = buf ;
         p < buf + buflen - 1
             && c != '>' && !isspace(c)
             && c != '\n' && c != '\r' && c != EOF ; )
    {
        /* store this character */
        *p++ = (char)c;

        /* get the next one */
        c = osfgetc(fp);
    }

    /* null-terminate the token */
    *p = '\0';

    /* return the character that ended the token */
    return c;
}